

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_writer.cpp
# Opt level: O2

void __thiscall duckdb::WKBColumnWriter::~WKBColumnWriter(WKBColumnWriter *this)

{
  ::std::__cxx11::string::~string((string *)&this->column_name);
  ColumnWriter::~ColumnWriter((ColumnWriter *)this);
  return;
}

Assistant:

WKBColumnWriter(ParquetWriter &writer, const ParquetColumnSchema &column_schema, vector<string> schema_path_p,
	                bool can_have_nulls, string name)
	    : StandardColumnWriter(writer, column_schema, std::move(schema_path_p), can_have_nulls),
	      column_name(std::move(name)) {

		this->writer.GetGeoParquetData().RegisterGeometryColumn(column_name);
	}